

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_func_get_arg(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  VmFrame *pVVar2;
  sxu32 nIdx;
  sxu32 *psVar3;
  jx9_value *pValue;
  jx9_vm *pVm;
  VmFrame *pFrame;
  VmSlot *pSlot;
  jx9_value *pObj;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pjVar1 = pCtx->pVm;
  pVVar2 = pjVar1->pFrame;
  if ((nArg < 1) || (pVVar2->pParent == (VmFrame *)0x0)) {
    jx9_context_throw_error(pCtx,2,"Called in the global scope");
    jx9_result_bool(pCtx,0);
  }
  else {
    nIdx = jx9_value_to_int(*apArg);
    if (((int)nIdx < 0) || ((int)(pVVar2->sArg).nUsed <= (int)nIdx)) {
      jx9_result_bool(pCtx,0);
    }
    else {
      psVar3 = (sxu32 *)SySetAt(&pVVar2->sArg,nIdx);
      if (psVar3 == (sxu32 *)0x0) {
        jx9_result_bool(pCtx,0);
      }
      else {
        pValue = (jx9_value *)SySetAt(&pjVar1->aMemObj,*psVar3);
        if (pValue == (jx9_value *)0x0) {
          jx9_result_bool(pCtx,0);
        }
        else {
          jx9_result_value(pCtx,pValue);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_func_get_arg(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	VmSlot *pSlot = 0;
	VmFrame *pFrame;
	jx9_vm *pVm;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Current frame */
	pFrame = pVm->pFrame;
	if( nArg < 1 || pFrame->pParent == 0 ){
		/* Global frame or Missing arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired index */
	nArg = jx9_value_to_int(apArg[0]);
	if( nArg < 0 || nArg >= (int)SySetUsed(&pFrame->sArg) ){
		/* Invalid index, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired argument */
	if( (pSlot = (VmSlot *)SySetAt(&pFrame->sArg, (sxu32)nArg)) != 0 ){
		if( (pObj = (jx9_value *)SySetAt(&pVm->aMemObj, pSlot->nIdx)) != 0 ){
			/* Return the desired argument */
			jx9_result_value(pCtx, (jx9_value *)pObj);
		}else{
			/* No such argument, return false */
			jx9_result_bool(pCtx, 0);
		}
	}else{
		/* CAN'T HAPPEN */
		jx9_result_bool(pCtx, 0);
	}
	return SXRET_OK;
}